

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O1

void lj_trace_reenableproto(GCproto *pt)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  if ((pt->flags & 0x10) != 0) {
    uVar1 = pt->sizebc;
    pt->flags = pt->flags & 0xef;
    if ((char)pt[1].nextgc.gcptr64 == 'Z') {
      *(undefined1 *)&pt[1].nextgc.gcptr64 = 0x59;
    }
    if (1 < uVar1) {
      lVar3 = 0;
      do {
        uVar2 = *(uint *)((long)&pt[1].nextgc.gcptr64 + lVar3 * 4 + 4);
        uVar4 = (uVar2 & 0xff) - 0x50;
        if ((uVar4 < 7) && ((0x49U >> (uVar4 & 0x1f) & 1) != 0)) {
          *(char *)((long)&pt[1].nextgc.gcptr64 + lVar3 * 4 + 4) = (char)uVar2 + -1;
        }
        lVar3 = lVar3 + 1;
      } while ((ulong)uVar1 - 1 != lVar3);
    }
  }
  return;
}

Assistant:

void lj_trace_reenableproto(GCproto *pt)
{
  if ((pt->flags & PROTO_ILOOP)) {
    BCIns *bc = proto_bc(pt);
    BCPos i, sizebc = pt->sizebc;
    pt->flags &= ~PROTO_ILOOP;
    if (bc_op(bc[0]) == BC_IFUNCF)
      setbc_op(&bc[0], BC_FUNCF);
    for (i = 1; i < sizebc; i++) {
      BCOp op = bc_op(bc[i]);
      if (op == BC_IFORL || op == BC_IITERL || op == BC_ILOOP)
	setbc_op(&bc[i], (int)op+(int)BC_LOOP-(int)BC_ILOOP);
    }
  }
}